

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O0

int dwarf_get_ATE_name(uint val,char **s_out)

{
  char **s_out_local;
  uint val_local;
  
  switch(val) {
  case 1:
    *s_out = "DW_ATE_address";
    s_out_local._4_4_ = 0;
    break;
  case 2:
    *s_out = "DW_ATE_boolean";
    s_out_local._4_4_ = 0;
    break;
  case 3:
    *s_out = "DW_ATE_complex_float";
    s_out_local._4_4_ = 0;
    break;
  case 4:
    *s_out = "DW_ATE_float";
    s_out_local._4_4_ = 0;
    break;
  case 5:
    *s_out = "DW_ATE_signed";
    s_out_local._4_4_ = 0;
    break;
  case 6:
    *s_out = "DW_ATE_signed_char";
    s_out_local._4_4_ = 0;
    break;
  case 7:
    *s_out = "DW_ATE_unsigned";
    s_out_local._4_4_ = 0;
    break;
  case 8:
    *s_out = "DW_ATE_unsigned_char";
    s_out_local._4_4_ = 0;
    break;
  case 9:
    *s_out = "DW_ATE_imaginary_float";
    s_out_local._4_4_ = 0;
    break;
  case 10:
    *s_out = "DW_ATE_packed_decimal";
    s_out_local._4_4_ = 0;
    break;
  case 0xb:
    *s_out = "DW_ATE_numeric_string";
    s_out_local._4_4_ = 0;
    break;
  case 0xc:
    *s_out = "DW_ATE_edited";
    s_out_local._4_4_ = 0;
    break;
  case 0xd:
    *s_out = "DW_ATE_signed_fixed";
    s_out_local._4_4_ = 0;
    break;
  case 0xe:
    *s_out = "DW_ATE_unsigned_fixed";
    s_out_local._4_4_ = 0;
    break;
  case 0xf:
    *s_out = "DW_ATE_decimal_float";
    s_out_local._4_4_ = 0;
    break;
  case 0x10:
    *s_out = "DW_ATE_UTF";
    s_out_local._4_4_ = 0;
    break;
  case 0x11:
    *s_out = "DW_ATE_UCS";
    s_out_local._4_4_ = 0;
    break;
  case 0x12:
    *s_out = "DW_ATE_ASCII";
    s_out_local._4_4_ = 0;
    break;
  default:
    s_out_local._4_4_ = -1;
    break;
  case 0x80:
    *s_out = "DW_ATE_ALTIUM_fract";
    s_out_local._4_4_ = 0;
    break;
  case 0x81:
    *s_out = "DW_ATE_ALTIUM_accum";
    s_out_local._4_4_ = 0;
    break;
  case 0x82:
    *s_out = "DW_ATE_HP_float128";
    s_out_local._4_4_ = 0;
    break;
  case 0x83:
    *s_out = "DW_ATE_HP_complex_float128";
    s_out_local._4_4_ = 0;
    break;
  case 0x84:
    *s_out = "DW_ATE_HP_floathpintel";
    s_out_local._4_4_ = 0;
    break;
  case 0x85:
    *s_out = "DW_ATE_HP_imaginary_float80";
    s_out_local._4_4_ = 0;
    break;
  case 0x86:
    *s_out = "DW_ATE_HP_imaginary_float128";
    s_out_local._4_4_ = 0;
    break;
  case 0x88:
    *s_out = "DW_ATE_HP_VAX_float";
    s_out_local._4_4_ = 0;
    break;
  case 0x89:
    *s_out = "DW_ATE_HP_VAX_float_d";
    s_out_local._4_4_ = 0;
    break;
  case 0x8a:
    *s_out = "DW_ATE_HP_packed_decimal";
    s_out_local._4_4_ = 0;
    break;
  case 0x8b:
    *s_out = "DW_ATE_HP_zoned_decimal";
    s_out_local._4_4_ = 0;
    break;
  case 0x8c:
    *s_out = "DW_ATE_HP_edited";
    s_out_local._4_4_ = 0;
    break;
  case 0x8d:
    *s_out = "DW_ATE_HP_signed_fixed";
    s_out_local._4_4_ = 0;
    break;
  case 0x8e:
    *s_out = "DW_ATE_HP_unsigned_fixed";
    s_out_local._4_4_ = 0;
    break;
  case 0x8f:
    *s_out = "DW_ATE_HP_VAX_complex_float";
    s_out_local._4_4_ = 0;
    break;
  case 0x90:
    *s_out = "DW_ATE_HP_VAX_complex_float_d";
    s_out_local._4_4_ = 0;
    break;
  case 0x91:
    *s_out = "DW_ATE_SUN_interval_float";
    s_out_local._4_4_ = 0;
    break;
  case 0x92:
    *s_out = "DW_ATE_SUN_imaginary_float";
    s_out_local._4_4_ = 0;
    break;
  case 0xff:
    *s_out = "DW_ATE_hi_user";
    s_out_local._4_4_ = 0;
  }
  return s_out_local._4_4_;
}

Assistant:

int
dwarf_get_ATE_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_ATE_address:
        *s_out = "DW_ATE_address";
        return DW_DLV_OK;
    case DW_ATE_boolean:
        *s_out = "DW_ATE_boolean";
        return DW_DLV_OK;
    case DW_ATE_complex_float:
        *s_out = "DW_ATE_complex_float";
        return DW_DLV_OK;
    case DW_ATE_float:
        *s_out = "DW_ATE_float";
        return DW_DLV_OK;
    case DW_ATE_signed:
        *s_out = "DW_ATE_signed";
        return DW_DLV_OK;
    case DW_ATE_signed_char:
        *s_out = "DW_ATE_signed_char";
        return DW_DLV_OK;
    case DW_ATE_unsigned:
        *s_out = "DW_ATE_unsigned";
        return DW_DLV_OK;
    case DW_ATE_unsigned_char:
        *s_out = "DW_ATE_unsigned_char";
        return DW_DLV_OK;
    case DW_ATE_imaginary_float:
        *s_out = "DW_ATE_imaginary_float";
        return DW_DLV_OK;
    case DW_ATE_packed_decimal:
        *s_out = "DW_ATE_packed_decimal";
        return DW_DLV_OK;
    case DW_ATE_numeric_string:
        *s_out = "DW_ATE_numeric_string";
        return DW_DLV_OK;
    case DW_ATE_edited:
        *s_out = "DW_ATE_edited";
        return DW_DLV_OK;
    case DW_ATE_signed_fixed:
        *s_out = "DW_ATE_signed_fixed";
        return DW_DLV_OK;
    case DW_ATE_unsigned_fixed:
        *s_out = "DW_ATE_unsigned_fixed";
        return DW_DLV_OK;
    case DW_ATE_decimal_float:
        *s_out = "DW_ATE_decimal_float";
        return DW_DLV_OK;
    case DW_ATE_UTF:
        *s_out = "DW_ATE_UTF";
        return DW_DLV_OK;
    case DW_ATE_UCS:
        *s_out = "DW_ATE_UCS";
        return DW_DLV_OK;
    case DW_ATE_ASCII:
        *s_out = "DW_ATE_ASCII";
        return DW_DLV_OK;
    case DW_ATE_ALTIUM_fract:
        *s_out = "DW_ATE_ALTIUM_fract";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0x80. DW_ATE_lo_user */
    /*  Skipping alternate spelling of value
        0x80. DW_ATE_HP_float80 */
    case DW_ATE_ALTIUM_accum:
        *s_out = "DW_ATE_ALTIUM_accum";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0x81. DW_ATE_HP_complex_float80 */
    case DW_ATE_HP_float128:
        *s_out = "DW_ATE_HP_float128";
        return DW_DLV_OK;
    case DW_ATE_HP_complex_float128:
        *s_out = "DW_ATE_HP_complex_float128";
        return DW_DLV_OK;
    case DW_ATE_HP_floathpintel:
        *s_out = "DW_ATE_HP_floathpintel";
        return DW_DLV_OK;
    case DW_ATE_HP_imaginary_float80:
        *s_out = "DW_ATE_HP_imaginary_float80";
        return DW_DLV_OK;
    case DW_ATE_HP_imaginary_float128:
        *s_out = "DW_ATE_HP_imaginary_float128";
        return DW_DLV_OK;
    case DW_ATE_HP_VAX_float:
        *s_out = "DW_ATE_HP_VAX_float";
        return DW_DLV_OK;
    case DW_ATE_HP_VAX_float_d:
        *s_out = "DW_ATE_HP_VAX_float_d";
        return DW_DLV_OK;
    case DW_ATE_HP_packed_decimal:
        *s_out = "DW_ATE_HP_packed_decimal";
        return DW_DLV_OK;
    case DW_ATE_HP_zoned_decimal:
        *s_out = "DW_ATE_HP_zoned_decimal";
        return DW_DLV_OK;
    case DW_ATE_HP_edited:
        *s_out = "DW_ATE_HP_edited";
        return DW_DLV_OK;
    case DW_ATE_HP_signed_fixed:
        *s_out = "DW_ATE_HP_signed_fixed";
        return DW_DLV_OK;
    case DW_ATE_HP_unsigned_fixed:
        *s_out = "DW_ATE_HP_unsigned_fixed";
        return DW_DLV_OK;
    case DW_ATE_HP_VAX_complex_float:
        *s_out = "DW_ATE_HP_VAX_complex_float";
        return DW_DLV_OK;
    case DW_ATE_HP_VAX_complex_float_d:
        *s_out = "DW_ATE_HP_VAX_complex_float_d";
        return DW_DLV_OK;
    case DW_ATE_SUN_interval_float:
        *s_out = "DW_ATE_SUN_interval_float";
        return DW_DLV_OK;
    case DW_ATE_SUN_imaginary_float:
        *s_out = "DW_ATE_SUN_imaginary_float";
        return DW_DLV_OK;
    case DW_ATE_hi_user:
        *s_out = "DW_ATE_hi_user";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}